

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void_(cppcms::http::context::completion_type)>::callback<unit_test::binder>
          (callback<void_(cppcms::http::context::completion_type)> *this,binder *func)

{
  intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_> *this_00;
  callable<void_(cppcms::http::context::completion_type)> *in_RSI;
  binder *in_RDI;
  binder *in_stack_ffffffffffffffa8;
  undefined1 add_ref;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffcc;
  callable_impl<void,_unit_test::binder> *in_stack_ffffffffffffffd0;
  
  this_00 = (intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_> *)
            operator_new(0x28);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc8);
  unit_test::binder::binder(in_RDI,in_stack_ffffffffffffffa8);
  add_ref = (undefined1)((ulong)in_RDI >> 0x38);
  callable_impl<void,_unit_test::binder>::callable_impl
            (in_stack_ffffffffffffffd0,(binder *)CONCAT44(in_stack_ffffffffffffffcc,uVar1));
  intrusive_ptr<booster::callable<void_(cppcms::http::context::completion_type)>_>::intrusive_ptr
            (this_00,in_RSI,(bool)add_ref);
  unit_test::binder::~binder((binder *)0x10cf98);
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}